

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O3

stringstream * __thiscall
Assimp::JSONWriter::LiteralToString(JSONWriter *this,stringstream *stream,aiString *s)

{
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  string t;
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  std::__cxx11::string::reserve((ulong)&local_50);
  if (s->length != 0) {
    uVar3 = 0;
    do {
      uVar2 = (byte)s->data[uVar3] - 0x22;
      if ((uVar2 < 0x3b) && ((0x400000000000021U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
        std::__cxx11::string::push_back((char)&local_50);
      }
      std::__cxx11::string::push_back((char)&local_50);
      uVar3 = uVar3 + 1;
    } while (uVar3 < s->length);
  }
  poVar1 = (ostream *)(stream + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return stream;
}

Assistant:

std::stringstream& LiteralToString(std::stringstream& stream, const aiString& s) {
        std::string t;

        // escape backslashes and single quotes, both would render the JSON invalid if left as is
        t.reserve(s.length);
        for (size_t i = 0; i < s.length; ++i) {

            if (s.data[i] == '\\' || s.data[i] == '\'' || s.data[i] == '\"') {
                t.push_back('\\');
            }

            t.push_back(s.data[i]);
        }
        stream << "\"";
        stream << t;
        stream << "\"";
        return stream;
    }